

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

err_t CallCreate(nodecontext *p,node *Node,nodeclass *Class)

{
  uint uVar1;
  nodemeta *pnVar2;
  err_t eVar3;
  long lVar4;
  size_t __n;
  
  if (Class != (nodeclass *)0x0) {
    if ((Class->ParentId != 0) && (Class->ParentClass == (nodeclass *)0x0)) {
      return -5;
    }
    eVar3 = CallCreate(p,Node,Class->ParentClass);
    if (eVar3 != 0) {
      return -5;
    }
    pnVar2 = Class->Meta;
    if ((pnVar2 == (nodemeta *)0x0) || (Class->State < '\x01')) {
      __assert_fail("Class->Meta && Class->State>=CLASS_INITED",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x318,"err_t CallCreate(nodecontext *, node *, const nodeclass *)");
    }
    uVar1 = *(uint *)pnVar2;
    while ((uVar1 & 0xff) != 0) {
      if ((uVar1 & 0xc0) == 0x80) {
        if ((0x20421e08642U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
          __n = (size_t)ParamSize[uVar1 & 0x3f];
          memset((void *)((long)&Node->FourCC + (ulong)(uVar1 >> 8)),0,__n);
          if (7 < __n) {
            __n = 8;
          }
          memcpy((void *)((long)&Node->FourCC + (ulong)(*(uint *)pnVar2 >> 8)),&pnVar2->Data,__n);
        }
        else {
          *(uintptr_t *)((long)&Node->FourCC + (ulong)(uVar1 >> 8)) = pnVar2->Data;
        }
      }
      else if ((char)uVar1 == '\r') {
LAB_00127ce3:
        lVar4 = (*(code *)pnVar2->Data)(Node);
        if (lVar4 != 0) {
          CallDelete(p,Node,Class->ParentClass);
          return -5;
        }
      }
      else if ((uVar1 & 0xff) == 0x5e) {
        if ((long)pnVar2->Data < 0) {
          if ((uVar1 & 0xff) == 0xd) goto LAB_00127ce3;
        }
        else {
          ArrayInitEx((array *)((long)&Node->FourCC + pnVar2->Data),p->NodeHeap);
        }
      }
      uVar1 = *(uint *)(pnVar2 + 1);
      pnVar2 = pnVar2 + 1;
    }
  }
  return 0;
}

Assistant:

static err_t CallCreate(nodecontext* p,node* Node,const nodeclass* Class)
{
    if (Class)
    {
        const nodemeta* i;

        if (Class->ParentId && !Class->ParentClass)
            return ERR_NOT_SUPPORTED;

        if (CallCreate(p,Node,Class->ParentClass)!=ERR_NONE)
            return ERR_NOT_SUPPORTED;

        assert(Class->Meta && Class->State>=CLASS_INITED);

        for (i=Class->Meta;i->Meta != META_CLASS_PARENT_ID;++i)
        {
            if ((i->Meta & META_MODE_MASK)==META_MODE_CONST)
                MetaConst(i,Node);
            else
            if (i->Meta == (META_MODE_DATA | TYPE_ARRAY) && (intptr_t)i->Data>=0)
            {
                array* Ptr = (void*)((uint8_t*)Node+i->Data);
                ArrayInitEx(Ptr,p->NodeHeap);
            }
            else
            if (i->Meta == META_CLASS_CREATE && ((err_t(*)(node*))i->Data)(Node) != ERR_NONE)
            {
                CallDelete(p,Node,Class->ParentClass);
                return ERR_NOT_SUPPORTED;
            }
        }
    }
    return ERR_NONE;
}